

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void ProcessThread::removePid(pid_t f_pid)

{
  iterator iVar1;
  key_type_conflict local_2c;
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::mutex::lock(&sProcessMutex);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_ProcessThread::ProcessData>,_std::_Select1st<std::pair<const_int,_ProcessThread::ProcessData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
          ::find(&sProcesses._M_t,&local_2c);
  if ((_Rb_tree_header *)iVar1._M_node != &sProcesses._M_t._M_impl.super__Rb_tree_header) {
    iVar1._M_node[1]._M_parent = (_Base_ptr)0x0;
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2> *)&iVar1._M_node[1]._M_left,
               &local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sProcessMutex);
  return;
}

Assistant:

void ProcessThread::removePid(pid_t f_pid)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);

    auto it = sProcesses.find(f_pid);
    if (it != sProcesses.end()) {
        it->second.proc = nullptr;
        it->second.loop = EventLoop::SharedPtr();
    }
}